

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_run(uv_loop_t *loop,uv_run_mode mode)

{
  uint *puVar1;
  uv_handle_type uVar2;
  long ****pppplVar3;
  long ***ppplVar4;
  uv_stream_t *puVar5;
  void *pvVar6;
  uv_stream_t *stream;
  int timeout;
  uint uVar7;
  uint64_t uVar8;
  void **ppvVar9;
  QUEUE *q;
  long ***local_48;
  long *local_40;
  void **local_38;
  
  if (((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) &&
     (loop->closing_handles == (uv_handle_t *)0x0)) {
    uVar8 = uv__hrtime(UV_CLOCK_FAST);
    loop->time = uVar8 / 1000000;
    uVar7 = 0;
  }
  else {
    ppvVar9 = loop->pending_queue;
    local_38 = ppvVar9;
    while (loop->stop_flag == 0) {
      uVar8 = uv__hrtime(UV_CLOCK_FAST);
      loop->time = uVar8 / 1000000;
      uv__run_timers(loop);
      pppplVar3 = (long ****)loop->pending_queue[0];
      if ((long ****)ppvVar9 != pppplVar3) {
        local_40 = (long *)loop->pending_queue[1];
        *local_40 = (long)&local_48;
        ppplVar4 = pppplVar3[1];
        loop->pending_queue[1] = ppplVar4;
        *ppplVar4 = (long **)ppvVar9;
        pppplVar3[1] = (long ***)&local_48;
        local_48 = (long ***)pppplVar3;
        while (&local_48 != (long ****)local_48) {
          ppplVar4 = (long ***)*local_48;
          *local_48[1] = (long *)ppplVar4;
          ppplVar4[1] = local_48[1];
          *local_48 = (long **)local_48;
          local_48[1] = (long **)local_48;
          (*(code *)local_48[-1])(loop,local_48 + -1,4);
        }
      }
      uv__run_idle(loop);
      uv__run_prepare(loop);
      if ((mode == UV_RUN_DEFAULT) ||
         (timeout = 0, mode == UV_RUN_ONCE && (long ****)ppvVar9 == pppplVar3)) {
        timeout = uv_backend_timeout(loop);
      }
      uv__io_poll(loop,timeout);
      uv__run_check(loop);
      puVar5 = (uv_stream_t *)loop->closing_handles;
      loop->closing_handles = (uv_handle_t *)0x0;
      ppvVar9 = local_38;
      while (stream = puVar5, local_38 = ppvVar9, stream != (uv_stream_t *)0x0) {
        uVar7 = stream->flags;
        if ((uVar7 & 1) == 0) {
          __assert_fail("handle->flags & UV_HANDLE_CLOSING",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                        ,0x100,"void uv__finish_close(uv_handle_t *)");
        }
        if ((uVar7 & 2) != 0) {
          __assert_fail("!(handle->flags & UV_HANDLE_CLOSED)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                        ,0x101,"void uv__finish_close(uv_handle_t *)");
        }
        puVar5 = (uv_stream_t *)stream->next_closing;
        stream->flags = uVar7 | 2;
        uVar2 = stream->type;
        if (UV_SIGNAL < uVar2) {
LAB_001b3263:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                        ,0x11c,"void uv__finish_close(uv_handle_t *)");
        }
        if ((0x1275eU >> (uVar2 & (UV_SIGNAL|UV_UDP)) & 1) == 0) {
          if ((0x5080U >> (uVar2 & (UV_SIGNAL|UV_UDP)) & 1) == 0) {
            if (uVar2 != UV_UDP) goto LAB_001b3263;
            uv__udp_finish_close((uv_udp_t *)stream);
          }
          else {
            uv__stream_destroy(stream);
          }
        }
        uVar7 = stream->flags;
        if (((uVar7 & 8) != 0) && (stream->flags = uVar7 & 0xfffffff7, (uVar7 & 5) == 4)) {
          puVar1 = &stream->loop->active_handles;
          *puVar1 = *puVar1 - 1;
        }
        pvVar6 = stream->handle_queue[0];
        *(void **)stream->handle_queue[1] = pvVar6;
        *(void **)((long)pvVar6 + 8) = stream->handle_queue[1];
        ppvVar9 = local_38;
        if (stream->close_cb != (uv_close_cb)0x0) {
          (*stream->close_cb)((uv_handle_t *)stream);
          ppvVar9 = local_38;
        }
      }
      if (mode == UV_RUN_ONCE) {
        uVar8 = uv__hrtime(UV_CLOCK_FAST);
        loop->time = uVar8 / 1000000;
        uv__run_timers(loop);
      }
      uVar7 = 1;
      if ((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) {
        uVar7 = (uint)(loop->closing_handles != (uv_handle_t *)0x0);
      }
      if ((0xfffffffd < mode + ~UV_RUN_NOWAIT) || (uVar7 == 0)) goto LAB_001b31e3;
    }
    uVar7 = 1;
  }
LAB_001b31e3:
  if (loop->stop_flag != 0) {
    loop->stop_flag = 0;
  }
  return uVar7;
}

Assistant:

int uv_run(uv_loop_t* loop, uv_run_mode mode) {
  int timeout;
  int r;
  int ran_pending;

  r = uv__loop_alive(loop);
  if (!r)
    uv__update_time(loop);

  while (r != 0 && loop->stop_flag == 0) {
    uv__update_time(loop);
    uv__run_timers(loop);
    ran_pending = uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);

    timeout = 0;
    if ((mode == UV_RUN_ONCE && !ran_pending) || mode == UV_RUN_DEFAULT)
      timeout = uv_backend_timeout(loop);

    uv__io_poll(loop, timeout);
    uv__run_check(loop);
    uv__run_closing_handles(loop);

    if (mode == UV_RUN_ONCE) {
      /* UV_RUN_ONCE implies forward progress: at least one callback must have
       * been invoked when it returns. uv__io_poll() can return without doing
       * I/O (meaning: no callbacks) when its timeout expires - which means we
       * have pending timers that satisfy the forward progress constraint.
       *
       * UV_RUN_NOWAIT makes no guarantees about progress so it's omitted from
       * the check.
       */
      uv__update_time(loop);
      uv__run_timers(loop);
    }

    r = uv__loop_alive(loop);
    if (mode == UV_RUN_ONCE || mode == UV_RUN_NOWAIT)
      break;
  }

  /* The if statement lets gcc compile it to a conditional store. Avoids
   * dirtying a cache line.
   */
  if (loop->stop_flag != 0)
    loop->stop_flag = 0;

  return r;
}